

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O1

Grammar * __thiscall
xercesc_4_0::XercesDOMParser::loadGrammar
          (XercesDOMParser *this,XMLCh *systemId,GrammarType grammarType,bool toCache)

{
  Grammar *pGVar1;
  IOException *this_00;
  ResetParseType_conflict resetParse;
  JanitorMemFunCall<xercesc_4_0::XercesDOMParser> local_28;
  
  if ((this->super_AbstractDOMParser).fParseInProgress != true) {
    local_28.fToCall = (MFPT)XercesDOMParser::resetParse;
    local_28._16_8_ = 0;
    (this->super_AbstractDOMParser).fParseInProgress = true;
    if (grammarType == DTDGrammarType) {
      ((this->super_AbstractDOMParser).fScanner)->fDocTypeHandler = (DocTypeHandler *)0x0;
    }
    local_28.fObject = this;
    pGVar1 = XMLScanner::loadGrammar
                       ((this->super_AbstractDOMParser).fScanner,systemId,(short)grammarType,toCache
                       );
    JanitorMemFunCall<xercesc_4_0::XercesDOMParser>::~JanitorMemFunCall(&local_28);
    return pGVar1;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x30);
  IOException::IOException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/parsers/XercesDOMParser.cpp"
             ,0x119,Gen_ParseInProgress,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_00,&IOException::typeinfo,XMLException::~XMLException);
}

Assistant:

Grammar* XercesDOMParser::loadGrammar(const XMLCh* const systemId,
                                      const Grammar::GrammarType grammarType,
                                      const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        ThrowXMLwithMemMgr(IOException, XMLExcepts::Gen_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &XercesDOMParser::resetParse);

    Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        grammar = getScanner()->loadGrammar(systemId, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}